

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildDryRunAllCommandsShown::Run(BuildDryRunAllCommandsShown *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  VirtualFileSystem *this_00;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_190 [8];
  string err;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  BuildDryRunAllCommandsShown *pBStack_10;
  int fail_count;
  BuildDryRunAllCommandsShown *this_local;
  
  pBStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.
               super_StateTestWithBuiltinRules.state_,
              "rule true\n  command = true\n  restat = 1\nrule cc\n  command = cc\n  restat = 1\nbuild out1: cc in\nbuild out2: true out1\nbuild out3: cat out2\n"
              ,local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out1",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create
              (&(this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.fs_,&local_40,
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"out2",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
    VirtualFileSystem::Create
              (&(this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.fs_,&local_a0,
               &local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"out3",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
    VirtualFileSystem::Create
              (&(this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.fs_,&local_f0,
               &local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    this_00 = &(this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.fs_;
    VirtualFileSystem::Tick(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"in",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(this_00,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::string((string *)local_190);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"out3",&local_1b1);
    pNVar5 = Builder::AddTarget(&(this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.
                                 builder_,&local_1b0,(string *)local_190);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x749,"builder_.AddTarget(\"out3\", &err)");
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_190);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x74a,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = Builder::Build(&(this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.
                              builder_,(string *)local_190);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x74b,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.
                      command_runner_.commands_ran_);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar6 == 3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x74c,"3u == command_runner_.commands_ran_.size()");
      if (!bVar3) {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    std::__cxx11::string::~string((string *)local_190);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildDryRun, AllCommandsShown) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule true\n"
"  command = true\n"
"  restat = 1\n"
"rule cc\n"
"  command = cc\n"
"  restat = 1\n"
"build out1: cc in\n"
"build out2: true out1\n"
"build out3: cat out2\n"));

  fs_.Create("out1", "");
  fs_.Create("out2", "");
  fs_.Create("out3", "");

  fs_.Tick();

  fs_.Create("in", "");

  // "cc" touches out1, so we should build out2.  But because "true" does not
  // touch out2, we should cancel the build of out3.
  string err;
  EXPECT_TRUE(builder_.AddTarget("out3", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());
}